

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_file_handle.cpp
# Opt level: O2

string * __thiscall
duckdb::CSVFileHandle::GetFilePath_abi_cxx11_(string *__return_storage_ptr__,CSVFileHandle *this)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->file);
  return __return_storage_ptr__;
}

Assistant:

string CSVFileHandle::GetFilePath() {
	return file.path;
}